

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_0::runTest
               (TestLog *log,ResultCollector *results,RenderContext *renderContext,
               BlendState *preCommonBlendState,BlendState *postCommonBlendState,
               vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
               *drawBuffers)

{
  deUint8 *pdVar1;
  glDisableiFunc *pp_Var2;
  int *piVar3;
  GLsizei GVar4;
  Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *pEVar5;
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  *pEVar6;
  BlendFunc *pBVar7;
  Vector<bool,_4> *pVVar8;
  GLboolean *pGVar9;
  GLenum *pGVar10;
  long lVar11;
  BlendState post;
  BlendState post_00;
  TextureFormat TVar12;
  undefined1 auVar13 [16];
  FragmentOperationState *this;
  undefined1 auVar14 [8];
  pointer pTVar15;
  pointer pTVar16;
  bool bVar17;
  char cVar18;
  int iVar19;
  deUint32 dVar20;
  TextureChannelClass TVar21;
  ContextType CVar22;
  uint uVar23;
  undefined4 extraout_var;
  ObjectTraits *pOVar25;
  TextureFormat *pTVar26;
  long *plVar27;
  pointer pDVar28;
  undefined4 extraout_var_00;
  char *pcVar29;
  _Alloc_hider _Var30;
  mapped_type *pmVar31;
  void *__dest;
  ostream *poVar32;
  size_t sVar33;
  glDisableiFunc *pp_Var34;
  bool *pbVar35;
  pointer pDVar36;
  undefined4 extraout_var_01;
  undefined8 *puVar37;
  uint uVar38;
  undefined4 uVar39;
  ulong uVar40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar41;
  size_type *psVar42;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar43;
  TextureLevel *pTVar44;
  char *pcVar45;
  long lVar46;
  TextureFormat TVar47;
  GLuint GVar48;
  long lVar49;
  GLenum GVar50;
  int iVar51;
  glEnableiFunc *pp_Var52;
  long lVar53;
  long lVar54;
  float fVar55;
  float fVar60;
  float fVar61;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar62;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  ChannelOrder CVar63;
  ChannelType CVar67;
  ChannelOrder CVar69;
  undefined1 auVar64 [16];
  ChannelType CVar71;
  undefined1 auVar65 [16];
  int iVar68;
  int iVar70;
  int iVar72;
  undefined1 auVar66 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  IVec4 IVar76;
  string desc;
  ScopedLogSection drawBufferSection;
  ScopedLogSection drawBuffersSection;
  VertexAttrib vertexAttribs [1];
  size_type __dnew_3;
  Vector<unsigned_long,_4> res_2;
  ScopedLogSection s;
  Vector<float,_4> res_4;
  TextureFormat format;
  TextureFormatInfo info;
  Renderer renderer;
  vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> refRenderbuffers;
  size_type __dnew_4;
  Framebuffer framebuffer;
  RenderbufferVector renderbuffers;
  size_type __dnew;
  Vec4 threshold;
  undefined4 in_stack_fffffffffffff938;
  undefined1 in_stack_fffffffffffff93c [12];
  char cVar77;
  undefined4 in_stack_fffffffffffff950;
  GLSLVersion GVar78;
  undefined4 in_stack_fffffffffffff954;
  Functions *pFVar79;
  undefined8 in_stack_fffffffffffff970;
  _Alloc_hider in_stack_fffffffffffff978;
  _Alloc_hider _Var80;
  undefined7 uVar81;
  undefined8 in_stack_fffffffffffff988;
  undefined8 uVar82;
  undefined8 uVar83;
  undefined8 uVar84;
  undefined1 in_stack_fffffffffffff990;
  undefined7 in_stack_fffffffffffff991;
  anon_union_8_2_d0736028_for_Maybe<tcu::Vector<bool,_4>_>_2 in_stack_fffffffffffff998;
  SeparateBlendEq local_660;
  anon_union_24_2_d0736028_for_Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>_2
  local_658;
  BlendFunc local_640;
  anon_union_32_2_d0736028_for_Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>_2
  aStack_638;
  undefined1 local_618 [16];
  key_type *local_608;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_600;
  PrimitiveList *local_5f0;
  undefined1 local_5e8 [12];
  uint uStack_5dc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5d8;
  _Base_ptr local_5c8;
  pointer local_5c0;
  BlendState *local_5b0;
  undefined1 local_5a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_598;
  undefined8 local_588;
  RenderContext *local_580;
  key_type local_578;
  undefined1 local_548 [8];
  TextureFormat TStack_540;
  undefined1 local_538 [100];
  undefined4 local_4d4;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> vStack_4b8;
  deUint32 local_4a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_498;
  uint uStack_480;
  undefined8 uStack_47c;
  undefined4 local_474;
  undefined1 local_470;
  undefined8 local_46c;
  undefined1 local_458 [8];
  TextureFormat TStack_450;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_448;
  pointer local_438;
  undefined4 local_420;
  undefined1 local_418;
  int local_414;
  int local_410;
  TextureFormat local_40c;
  pointer local_400;
  undefined1 local_3f8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c8;
  BlendFunc local_3b8;
  BlendFunc BStack_3b0;
  undefined1 local_3a8 [24];
  bool local_390;
  string local_388;
  ResultCollector *local_360;
  ulong local_358;
  TextureFormat local_350;
  undefined1 local_348 [8];
  undefined1 auStack_340 [8];
  undefined1 local_338 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_330;
  ulong local_320;
  VertexArrayPointer local_318 [2];
  ios_base local_2d8 [8];
  ios_base local_2d0 [264];
  PrimitiveType local_1c8;
  uint uStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  long local_1b0;
  long local_1a8;
  vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> local_1a0;
  PrimitiveList local_188;
  ObjectWrapper local_160;
  TextureFormat local_148;
  ObjectVector local_140;
  ShaderProgram local_118;
  Vec4 local_48;
  Functions *pFVar24;
  
  local_538._8_8_ = local_538._0_8_;
  local_5b0 = preCommonBlendState;
  local_580 = renderContext;
  local_360 = results;
  iVar19 = (*renderContext->_vptr_RenderContext[3])(renderContext);
  pFVar24 = (Functions *)CONCAT44(extraout_var,iVar19);
  pDVar28 = (drawBuffers->
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  pDVar36 = (drawBuffers->
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pOVar25 = glu::objectTraits(OBJECTTYPE_RENDERBUFFER);
  glu::ObjectVector::ObjectVector(&local_140,pFVar24,pOVar25,(long)pDVar28 - (long)pDVar36 >> 7);
  pOVar25 = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_160,pFVar24,pOVar25);
  std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::vector
            (&local_1a0,
             (long)(drawBuffers->
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(drawBuffers->
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 7,(allocator_type *)local_348);
  uVar82 = local_538._8_8_;
  local_348 = (undefined1  [8])local_338;
  local_338._0_4_ = 4.5725952e+33;
  local_338._4_2_ = 0x7542;
  local_338[6] = 'f';
  local_338[7] = 'f';
  aStack_330._M_local_buf[0] = 'e';
  aStack_330._1_2_ = 0x7372;
  auStack_340._0_4_ = BGRA;
  auStack_340._4_4_ = SNORM_INT8;
  aStack_330._M_local_buf[3] = '\0';
  local_538._8_4_ = 0x73726566;
  local_538._0_8_ = 0x6675622077617244;
  TStack_540 = (TextureFormat)0xc;
  local_548 = (undefined1  [8])local_538;
  local_538._13_3_ = SUB83(uVar82,5);
  local_538[0xc] = 0;
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)local_5e8,log,(string *)local_348,(string *)local_548);
  if (local_548 != (undefined1  [8])local_538) {
    operator_delete((void *)local_548,local_538._0_8_ + 1);
  }
  if (local_348 != (undefined1  [8])local_338) {
    operator_delete((void *)local_348,
                    CONCAT17(local_338[7],
                             CONCAT16(local_338[6],CONCAT24(local_338._4_2_,local_338._0_4_))) + 1);
  }
  lVar46 = CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950);
  if (0 < (int)((ulong)((long)(drawBuffers->
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(drawBuffers->
                             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 7)) {
    lVar46 = 0;
    lVar49 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_348);
      std::ostream::operator<<((MessageBuilder *)local_348,(int)lVar49);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_348);
      std::ios_base::~ios_base(local_2d8);
      pTVar26 = (TextureFormat *)
                std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,0x1ccbe18);
      TVar47 = (TextureFormat)(pTVar26 + 2);
      if (*pTVar26 == TVar47) {
        local_538._0_16_ = *(undefined1 (*) [16])TVar47;
        TVar12 = (TextureFormat)local_538;
      }
      else {
        local_538._0_8_ = *(size_type *)TVar47;
        TVar12 = *pTVar26;
      }
      TStack_540.order = pTVar26[1].order;
      TStack_540.type = pTVar26[1].type;
      local_548._0_4_ = TVar12.order;
      local_548._4_4_ = TVar12.type;
      *pTVar26 = TVar47;
      pTVar26[1].order = R;
      pTVar26[1].type = SNORM_INT8;
      *(undefined1 *)&pTVar26[2].order = R;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_348);
      std::ostream::operator<<((MessageBuilder *)local_348,(int)lVar49);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_348);
      std::ios_base::~ios_base(local_2d8);
      pTVar26 = (TextureFormat *)
                std::__cxx11::string::replace
                          ((ulong)&stack0xfffffffffffff978,0,(char *)0x0,0x1c92fae);
      local_458 = (undefined1  [8])&local_448;
      TVar47 = (TextureFormat)(pTVar26 + 2);
      if (*pTVar26 == TVar47) {
        local_448._M_allocated_capacity = *(undefined8 *)TVar47;
        local_448._8_8_ = pTVar26[3];
      }
      else {
        local_448._M_allocated_capacity = *(undefined8 *)TVar47;
        local_458 = (undefined1  [8])*pTVar26;
      }
      TStack_450 = pTVar26[1];
      *pTVar26 = TVar47;
      pTVar26[1].order = R;
      pTVar26[1].type = SNORM_INT8;
      *(undefined1 *)&pTVar26[2].order = R;
      tcu::ScopedLogSection::ScopedLogSection
                ((ScopedLogSection *)local_618,log,(string *)local_548,(string *)local_458);
      if (local_458 != (undefined1  [8])&local_448) {
        operator_delete((void *)local_458,(ulong)(local_448._M_allocated_capacity + 1));
      }
      if (in_stack_fffffffffffff978._M_p != &stack0xfffffffffffff988) {
        operator_delete(in_stack_fffffffffffff978._M_p,in_stack_fffffffffffff988 + 1);
      }
      if (local_548 != (undefined1  [8])local_538) {
        operator_delete((void *)local_548,local_538._0_8_ + 1);
      }
      if (local_118.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          (pointer)&local_118.m_shaders[0].
                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
        operator_delete(local_118.m_shaders[0].
                        super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_118.m_shaders[0].
                              super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
      }
      pDVar28 = (drawBuffers->
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                )._M_impl.super__Vector_impl_data._M_start;
      local_348 = (undefined1  [8])log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_340);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_340,"Format: ",8);
      tcu::operator<<((ostream *)auStack_340,
                      *(TextureFormat *)
                       ((long)&((TextureFormat *)(&pDVar28->m_size + 1))->order + lVar46));
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_348,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_340);
      std::ios_base::~ios_base(local_2d0);
      local_348 = (undefined1  [8])log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_340);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_340,"Size: ",6);
      tcu::operator<<((ostream *)auStack_340,
                      (Vector<int,_2> *)((long)(pDVar28->m_size).m_data + lVar46));
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_348,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_340);
      std::ios_base::~ios_base(local_2d0);
      local_348 = (undefined1  [8])log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_340);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_340,"Render: ",8);
      uVar40 = (ulong)*(byte *)((long)(pDVar28->m_size).m_data + lVar46 + -4);
      pcVar45 = "false";
      if (uVar40 != 0) {
        pcVar45 = "true";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_340,pcVar45,uVar40 ^ 5);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_348,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_340);
      std::ios_base::~ios_base(local_2d0);
      tcu::TestLog::endSection((TestLog *)local_618._0_8_);
      lVar49 = lVar49 + 1;
      lVar46 = lVar46 + 0x80;
    } while (lVar49 < (int)((ulong)((long)(drawBuffers->
                                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(drawBuffers->
                                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                                         )._M_impl.super__Vector_impl_data._M_start) >> 7));
  }
  tcu::TestLog::endSection((TestLog *)local_5e8._0_8_);
  auVar57._0_4_ =
       -(uint)(*(int *)&(local_5b0->enableBlend).m_ptr == 0 &&
              *(int *)&(local_5b0->blendFunc).m_ptr == 0);
  auVar57._4_4_ =
       -(uint)(*(int *)((long)&(local_5b0->enableBlend).m_ptr + 4) == 0 &&
              *(int *)((long)&(local_5b0->blendFunc).m_ptr + 4) == 0);
  auVar57._8_4_ =
       -(uint)(*(int *)&(local_5b0->blendEq).field_1 == 0 &&
              *(int *)&(local_5b0->colorMask).field_1 == 0);
  auVar57._12_4_ =
       -(uint)(*(int *)((long)&(local_5b0->blendEq).field_1 + 4) == 0 &&
              *(int *)((long)&(local_5b0->colorMask).field_1 + 4) == 0);
  iVar19 = movmskps((int)local_5b0,auVar57);
  if (iVar19 != 0xf) {
    local_348 = (undefined1  [8])local_338;
    local_338._0_4_ = 229.44653;
    local_338._4_2_ = 0x6d6f;
    local_338[6] = 'm';
    local_338[7] = 'o';
    aStack_330._M_local_buf[0] = 'n';
    aStack_330._1_2_ = 0x7453;
    aStack_330._M_local_buf[3] = 'a';
    aStack_330._4_2_ = 0x6574;
    auStack_340._0_4_ = sRGB;
    auStack_340._4_4_ = SNORM_INT8;
    aStack_330._M_local_buf[6] = '\0';
    local_118.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x1c;
    local_548 = (undefined1  [8])local_538;
    local_548 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_548,(ulong)&local_118);
    local_538._0_8_ =
         local_118.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
         _M_impl.super__Vector_impl_data._M_start;
    builtin_strncpy((char *)local_548,"First set common blend state",0x1c);
    TStack_540 = (TextureFormat)
                 local_118.m_shaders[0].
                 super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
    *(char *)((long)local_548 +
             (long)local_118.m_shaders[0].
                   super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                   super__Vector_impl_data._M_start) = '\0';
    tcu::ScopedLogSection::ScopedLogSection
              ((ScopedLogSection *)local_458,log,(string *)local_348,(string *)local_548);
    if (local_548 != (undefined1  [8])local_538) {
      operator_delete((void *)local_548,local_538._0_8_ + 1);
    }
    if (local_348 != (undefined1  [8])local_338) {
      operator_delete((void *)local_348,
                      CONCAT17(local_338[7],
                               CONCAT16(local_338[6],CONCAT24(local_338._4_2_,local_338._0_4_))) + 1
                     );
    }
    logBlendState(log,local_5b0);
    tcu::TestLog::endSection((TestLog *)local_458);
  }
  pDVar28 = (drawBuffers->
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pDVar36 = (drawBuffers->
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  uVar40 = (ulong)((long)pDVar36 - (long)pDVar28) >> 7;
  if (0 < (int)uVar40) {
    lVar53 = 0x18;
    lVar49 = 0;
    do {
      piVar3 = (int *)((long)(pDVar28->m_size).m_data + lVar53 + -4);
      auVar73._0_4_ =
           -(uint)(*piVar3 == 0 && *(int *)((long)(&pDVar28->m_size + 5) + lVar53 + 4) == 0);
      auVar73._4_4_ =
           -(uint)(piVar3[1] == 0 && ((int *)((long)(&pDVar28->m_size + 5) + lVar53 + 4))[1] == 0);
      auVar73._8_4_ =
           -(uint)(*(int *)((long)(&pDVar28->m_size + 2) + lVar53 + 4) == 0 &&
                  *(int *)((long)(&pDVar28->m_size + 0xb) + lVar53 + 4) == 0);
      auVar73._12_4_ =
           -(uint)(*(int *)((long)(&pDVar28->m_size + 3) + lVar53) == 0 &&
                  *(int *)((long)(&pDVar28->m_size + 0xc) + lVar53) == 0);
      iVar19 = movmskps((int)uVar40,auVar73);
      if (iVar19 != 0xf) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_348);
        std::ostream::operator<<((ostringstream *)local_348,(int)lVar49);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_348);
        std::ios_base::~ios_base(local_2d8);
        plVar27 = (long *)std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,0x1c92ff0);
        local_548 = (undefined1  [8])local_538;
        paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar27 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar27 == paVar41) {
          local_538._0_16_ = *(undefined1 (*) [16])paVar41;
        }
        else {
          local_538._0_8_ = paVar41->_M_allocated_capacity;
          local_548 = (undefined1  [8])*plVar27;
        }
        TStack_540 = (TextureFormat)plVar27[1];
        *plVar27 = (long)paVar41;
        plVar27[1] = 0;
        *(undefined1 *)(plVar27 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_348);
        std::ostream::operator<<((ostringstream *)local_348,(int)lVar49);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_348);
        std::ios_base::~ios_base(local_2d8);
        plVar27 = (long *)std::__cxx11::string::replace((ulong)local_5e8,0,(char *)0x0,0x1c93000);
        psVar42 = (size_type *)(plVar27 + 2);
        if ((size_type *)*plVar27 == psVar42) {
          uVar82 = *psVar42;
          in_stack_fffffffffffff990 = (undefined1)plVar27[3];
          in_stack_fffffffffffff991 = (undefined7)((ulong)plVar27[3] >> 8);
          _Var30._M_p = &stack0xfffffffffffff988;
        }
        else {
          uVar82 = *psVar42;
          _Var30._M_p = (pointer)*plVar27;
        }
        *plVar27 = (long)psVar42;
        plVar27[1] = 0;
        *(undefined1 *)(plVar27 + 2) = 0;
        pTVar26 = (TextureFormat *)std::__cxx11::string::append(&stack0xfffffffffffff978);
        TVar47 = (TextureFormat)(pTVar26 + 2);
        if (*pTVar26 == TVar47) {
          local_448._M_allocated_capacity = *(undefined8 *)TVar47;
          local_448._8_8_ = pTVar26[3];
          local_458 = (undefined1  [8])&local_448;
        }
        else {
          local_448._M_allocated_capacity = *(undefined8 *)TVar47;
          local_458 = (undefined1  [8])*pTVar26;
        }
        TStack_450 = pTVar26[1];
        *pTVar26 = TVar47;
        pTVar26[1].order = R;
        pTVar26[1].type = SNORM_INT8;
        *(undefined1 *)&pTVar26[2].order = R;
        tcu::ScopedLogSection::ScopedLogSection
                  ((ScopedLogSection *)local_618,log,(string *)local_548,(string *)local_458);
        if (local_458 != (undefined1  [8])&local_448) {
          operator_delete((void *)local_458,(ulong)(local_448._M_allocated_capacity + 1));
        }
        if (_Var30._M_p != &stack0xfffffffffffff988) {
          operator_delete(_Var30._M_p,uVar82 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5e8._0_8_ != &local_5d8) {
          operator_delete((void *)local_5e8._0_8_,local_5d8._M_allocated_capacity + 1);
        }
        if (local_548 != (undefined1  [8])local_538) {
          operator_delete((void *)local_548,local_538._0_8_ + 1);
        }
        if (local_118.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&local_118.m_shaders[0].
                      super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
          operator_delete(local_118.m_shaders[0].
                          super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_118.m_shaders[0].
                                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
        logBlendState(log,(BlendState *)
                          ((long)(((drawBuffers->
                                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->m_size).m_data +
                          lVar53 + -4));
        tcu::TestLog::endSection((TestLog *)local_618._0_8_);
        pDVar28 = (drawBuffers->
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pDVar36 = (drawBuffers->
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      }
      lVar49 = lVar49 + 1;
      uVar40 = (ulong)(int)((ulong)((long)pDVar36 - (long)pDVar28) >> 7);
      lVar53 = lVar53 + 0x80;
    } while (lVar49 < (long)uVar40);
  }
  auVar74._0_4_ =
       -(uint)(*(int *)&(postCommonBlendState->enableBlend).m_ptr == 0 &&
              *(int *)&(postCommonBlendState->blendFunc).m_ptr == 0);
  auVar74._4_4_ =
       -(uint)(*(int *)((long)&(postCommonBlendState->enableBlend).m_ptr + 4) == 0 &&
              *(int *)((long)&(postCommonBlendState->blendFunc).m_ptr + 4) == 0);
  auVar74._8_4_ =
       -(uint)(*(int *)&(postCommonBlendState->blendEq).field_1 == 0 &&
              *(int *)&(postCommonBlendState->colorMask).field_1 == 0);
  auVar74._12_4_ =
       -(uint)(*(int *)((long)&(postCommonBlendState->blendEq).field_1 + 4) == 0 &&
              *(int *)((long)&(postCommonBlendState->colorMask).field_1 + 4) == 0);
  iVar19 = movmskps((int)postCommonBlendState,auVar74);
  pFVar79 = pFVar24;
  if (iVar19 != 0xf) {
    local_348 = (undefined1  [8])local_338;
    local_338._0_4_ = 7.714757e+31;
    local_338._4_2_ = 0x6f43;
    local_338[6] = 'm';
    local_338[7] = 'm';
    aStack_330._M_local_buf[0] = 'o';
    aStack_330._1_2_ = 0x536e;
    aStack_330._M_local_buf[3] = 't';
    aStack_330._4_2_ = 0x7461;
    aStack_330._M_local_buf[6] = 'e';
    auStack_340._0_4_ = sRGBA;
    auStack_340._4_4_ = SNORM_INT8;
    aStack_330._M_local_buf[7] = '\0';
    local_118.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x1c;
    local_548 = (undefined1  [8])local_538;
    local_548 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_548,(ulong)&local_118);
    local_538._0_8_ =
         local_118.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
         _M_impl.super__Vector_impl_data._M_start;
    builtin_strncpy((char *)local_548,"After set common blend state",0x1c);
    TStack_540 = (TextureFormat)
                 local_118.m_shaders[0].
                 super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
    *(char *)((long)local_548 +
             (long)local_118.m_shaders[0].
                   super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                   super__Vector_impl_data._M_start) = '\0';
    tcu::ScopedLogSection::ScopedLogSection
              ((ScopedLogSection *)local_458,log,(string *)local_348,(string *)local_548);
    if (local_548 != (undefined1  [8])local_538) {
      operator_delete((void *)local_548,local_538._0_8_ + 1);
    }
    if (local_348 != (undefined1  [8])local_338) {
      operator_delete((void *)local_348,
                      CONCAT17(local_338[7],
                               CONCAT16(local_338[6],CONCAT24(local_338._4_2_,local_338._0_4_))) + 1
                     );
    }
    logBlendState(log,postCommonBlendState);
    tcu::TestLog::endSection((TestLog *)local_458);
    pDVar28 = (drawBuffers->
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pDVar36 = (drawBuffers->
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  }
  local_118.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_118,
             (long)pDVar36 - (long)pDVar28 >> 7);
  (*pFVar24->bindFramebuffer)(0x8d40,local_160.m_object);
  pDVar28 = (drawBuffers->
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(drawBuffers->
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pDVar28) >> 7)) {
    lVar49 = 0x18;
    lVar54 = 0xc;
    lVar53 = 0;
    do {
      dVar20 = glu::getInternalFormat
                         (*(TextureFormat *)((long)(pDVar28->m_size).m_data + lVar54 + -4));
      GVar50 = (int)lVar53 + 0x8ce0;
      *(GLenum *)
       ((long)local_118.m_shaders[0].
              super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
              super__Vector_impl_data._M_start + lVar53 * 4) = GVar50;
      tcu::TextureLevel::TextureLevel
                ((TextureLevel *)local_348,
                 (TextureFormat *)((long)(pDVar28->m_size).m_data + lVar54 + -4),
                 *(int *)((long)(&pDVar28->m_size + -2) + 4 + lVar54),
                 *(int *)((long)(&pDVar28->m_size + -1) + lVar54),1);
      *(undefined4 *)
       ((long)((local_1a0.super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
                _M_impl.super__Vector_impl_data._M_start)->m_size).m_data + lVar49 + -0x10) =
           local_338._0_4_;
      pTVar26 = (TextureFormat *)
                ((long)(&(local_1a0.
                          super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
                          _M_impl.super__Vector_impl_data._M_start)->m_size + -3) + 4 + lVar49);
      pTVar26->order = local_348._0_4_;
      pTVar26->type = local_348._4_4_;
      pTVar26[1].order = auStack_340._0_4_;
      pTVar26[1].type = auStack_340._4_4_;
      de::ArrayBuffer<unsigned_char,_1UL,_1UL>::operator=
                ((ArrayBuffer<unsigned_char,_1UL,_1UL> *)
                 ((long)((local_1a0.
                          super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
                          _M_impl.super__Vector_impl_data._M_start)->m_size).m_data + lVar49 + -8),
                 (ArrayBuffer<unsigned_char,_1UL,_1UL> *)(local_338 + 8));
      tcu::TextureLevel::~TextureLevel((TextureLevel *)local_348);
      (*pFVar79->bindRenderbuffer)
                (0x8d41,local_140.m_objects.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar53]);
      (*pFVar79->renderbufferStorage)
                (0x8d41,dVar20,*(GLsizei *)((long)(&pDVar28->m_size + -2) + 4 + lVar54),
                 *(GLsizei *)((long)(&pDVar28->m_size + -1) + lVar54));
      (*pFVar79->framebufferRenderbuffer)
                (0x8d40,GVar50,0x8d41,
                 local_140.m_objects.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar53]);
      GVar50 = (*pFVar79->getError)();
      glu::checkError(GVar50,"Failed to create renderbuffer.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawBuffersIndexedTests.cpp"
                      ,0x1a2);
      lVar53 = lVar53 + 1;
      pDVar28 = (drawBuffers->
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar49 = lVar49 + 0x28;
      lVar54 = lVar54 + 0x80;
    } while (lVar53 < (int)((ulong)((long)(drawBuffers->
                                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)pDVar28) >> 7));
  }
  (*pFVar79->drawBuffers)
            ((GLsizei)((ulong)((long)local_118.m_shaders[0].
                                     super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_118.m_shaders[0].
                                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 2),
             (GLenum *)
             local_118.m_shaders[0].
             super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
             super__Vector_impl_data._M_start);
  pDVar28 = (drawBuffers->
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(drawBuffers->
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pDVar28) >> 7)) {
    local_1b0 = 0;
    lVar49 = 0xc;
    local_358 = 0;
    lVar46 = 0;
    do {
      pTVar16 = local_1a0.super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      pTVar15 = local_1a0.super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_1a8 = lVar49;
      tcu::getTextureFormatInfo
                ((TextureFormatInfo *)local_348,
                 (TextureFormat *)((long)(pDVar28->m_size).m_data + lVar49 + -4));
      iVar68 = (int)lVar46;
      iVar19 = (int)((ulong)((long)pTVar16 - (long)pTVar15) >> 3) * -0x33333333;
      iVar51 = (int)local_358 + iVar19;
      TVar21 = tcu::getTextureChannelClass
                         (*(ChannelType *)((long)(pDVar28->m_size).m_data + local_1a8));
      if (TVar21 < TEXTURECHANNELCLASS_LAST) {
        auVar64._0_4_ = (float)iVar19;
        pTVar44 = (TextureLevel *)((long)(pTVar15->m_size).m_data + local_1b0 + -8);
        auVar56._0_4_ = (float)((int)lVar46 + 1);
        auVar56._4_4_ = (float)((iVar68 + iVar19 / 2) % iVar19);
        auVar56._8_4_ = (float)iVar51;
        auVar56._12_4_ = (float)((iVar19 / 2 + iVar51) % iVar19 + 1);
        auVar64._4_4_ = auVar64._0_4_;
        auVar64._8_4_ = auVar64._0_4_;
        auVar64._12_4_ = auVar64._0_4_;
        auVar57 = divps(auVar56,auVar64);
        fVar55 = auVar57._0_4_;
        fVar60 = auVar57._4_4_;
        fVar61 = auVar57._8_4_;
        fVar62 = auVar57._12_4_;
        switch(TVar21) {
        case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
          local_458._4_4_ =
               ((float)CONCAT13(local_338[7],CONCAT12(local_338[6],local_338._4_2_)) -
               (float)local_348._4_4_) * fVar60 + (float)local_348._4_4_;
          local_458._0_4_ =
               ((float)local_338._0_4_ - (float)local_348._0_4_) * fVar55 + (float)local_348._0_4_;
          TStack_450.type =
               (ChannelType)
               (((float)CONCAT13(aStack_330._M_local_buf[7],
                                 CONCAT12(aStack_330._M_local_buf[6],aStack_330._4_2_)) -
                (float)auStack_340._4_4_) * fVar62 + (float)auStack_340._4_4_);
          TStack_450.order =
               (ChannelOrder)
               (((float)CONCAT13(aStack_330._M_local_buf[3],
                                 CONCAT21(aStack_330._1_2_,aStack_330._M_local_buf[0])) -
                (float)auStack_340._0_4_) * fVar61 + (float)auStack_340._0_4_);
          tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_548,pTVar44);
          tcu::clear((PixelBufferAccess *)local_548,(Vec4 *)local_458);
          (*pFVar79->clearBufferfv)(0x1800,(GLint)lVar46,(GLfloat *)local_458);
          break;
        case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
          local_458._4_4_ =
               fVar60 * (float)CONCAT13(local_338[7],CONCAT12(local_338[6],local_338._4_2_));
          local_458._0_4_ = fVar55 * (float)local_338._0_4_;
          TStack_450.type =
               (ChannelType)
               (fVar62 * (float)CONCAT13(aStack_330._M_local_buf[7],
                                         CONCAT12(aStack_330._M_local_buf[6],aStack_330._4_2_)));
          TStack_450.order =
               (ChannelOrder)
               (fVar61 * (float)CONCAT13(aStack_330._M_local_buf[3],
                                         CONCAT21(aStack_330._1_2_,aStack_330._M_local_buf[0])));
          tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_548,pTVar44);
          tcu::clear((PixelBufferAccess *)local_548,(Vec4 *)local_458);
          (*pFVar79->clearBufferfv)(0x1800,(GLint)lVar46,(GLfloat *)local_458);
          break;
        case TEXTURECHANNELCLASS_SIGNED_INTEGER:
          local_458._4_4_ =
               (int)(((float)CONCAT13(local_338[7],CONCAT12(local_338[6],local_338._4_2_)) -
                     (float)local_348._4_4_) * fVar60 + (float)local_348._4_4_);
          local_458._0_4_ =
               (int)(((float)local_338._0_4_ - (float)local_348._0_4_) * fVar55 +
                    (float)local_348._0_4_);
          TStack_450.type =
               (int)(((float)CONCAT13(aStack_330._M_local_buf[7],
                                      CONCAT12(aStack_330._M_local_buf[6],aStack_330._4_2_)) -
                     (float)auStack_340._4_4_) * fVar62 + (float)auStack_340._4_4_);
          TStack_450.order =
               (int)(((float)CONCAT13(aStack_330._M_local_buf[3],
                                      CONCAT21(aStack_330._1_2_,aStack_330._M_local_buf[0])) -
                     (float)auStack_340._0_4_) * fVar61 + (float)auStack_340._0_4_);
          tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_548,pTVar44);
          tcu::clear((PixelBufferAccess *)local_548,(IVec4 *)local_458);
          (*pFVar79->clearBufferiv)(0x1800,(GLint)lVar46,(GLint *)local_458);
          break;
        case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
          fVar60 = fVar60 * (float)CONCAT13(local_338[7],CONCAT12(local_338[6],local_338._4_2_));
          fVar61 = fVar61 * (float)CONCAT13(aStack_330._M_local_buf[3],
                                            CONCAT21(aStack_330._1_2_,aStack_330._M_local_buf[0]));
          fVar62 = fVar62 * (float)CONCAT13(aStack_330._M_local_buf[7],
                                            CONCAT12(aStack_330._M_local_buf[6],aStack_330._4_2_));
          CVar63 = (ChannelOrder)(fVar55 * (float)local_338._0_4_);
          CVar67 = (ChannelType)fVar60;
          CVar69 = (ChannelOrder)fVar61;
          CVar71 = (ChannelType)fVar62;
          local_458._4_4_ = (int)(fVar60 - 2.1474836e+09) & (int)CVar67 >> 0x1f | CVar67;
          local_458._0_4_ =
               (int)(fVar55 * (float)local_338._0_4_ - 2.1474836e+09) & (int)CVar63 >> 0x1f | CVar63
          ;
          TStack_450.type = (int)(fVar62 - 2.1474836e+09) & (int)CVar71 >> 0x1f | CVar71;
          TStack_450.order = (int)(fVar61 - 2.1474836e+09) & (int)CVar69 >> 0x1f | CVar69;
          tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_548,pTVar44);
          tcu::clear((PixelBufferAccess *)local_548,(UVec4 *)local_458);
          (*pFVar79->clearBufferuiv)(0x1800,(GLint)lVar46,(GLuint *)local_458);
          break;
        case TEXTURECHANNELCLASS_FLOATING_POINT:
          local_458._4_4_ = fVar60 * 2000.0 + -1000.0;
          local_458._0_4_ = fVar55 * 2000.0 + -1000.0;
          TStack_450.type = (ChannelType)(fVar62 * 2000.0 + -1000.0);
          TStack_450.order = (ChannelOrder)(fVar61 * 2000.0 + -1000.0);
          tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_548,pTVar44);
          tcu::clear((PixelBufferAccess *)local_548,(Vec4 *)local_458);
          (*pFVar79->clearBufferfv)(0x1800,(GLint)lVar46,(GLfloat *)local_458);
        }
      }
      GVar50 = (*pFVar79->getError)();
      glu::checkError(GVar50,"Failed to clear renderbuffer.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawBuffersIndexedTests.cpp"
                      ,0x183);
      lVar46 = lVar46 + 1;
      pDVar28 = (drawBuffers->
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                )._M_impl.super__Vector_impl_data._M_start;
      local_358 = (ulong)((int)local_358 - 1);
      local_1b0 = local_1b0 + 0x28;
      lVar49 = local_1a8 + 0x80;
    } while (lVar46 < (int)((ulong)((long)(drawBuffers->
                                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)pDVar28) >> 7));
  }
  (*pFVar79->bindRenderbuffer)(0x8d41,0);
  (*pFVar79->bindFramebuffer)(0x8d40,0);
  if ((TextureFormat)
      local_118.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (TextureFormat)0x0) {
    operator_delete(local_118.m_shaders[0].
                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_118.m_shaders[0].
                          super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.m_shaders[0].
                          super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  iVar19 = (*local_580->_vptr_RenderContext[3])();
  pFVar24 = (Functions *)CONCAT44(extraout_var_00,iVar19);
  memset(local_548,0,0xac);
  local_498.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_498.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_498.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_498.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_498.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  uStack_480 = uStack_480 & 0xffffff00;
  CVar22.super_ApiType.m_bits = (ApiType)(*local_580->_vptr_RenderContext[2])();
  bVar17 = glu::contextSupports(CVar22,(ApiType)0x23);
  aStack_330._8_8_ = auStack_340;
  auStack_340 = (undefined1  [8])((ulong)auStack_340 & 0xffffffff00000000);
  local_338._0_4_ = 0;
  local_338._4_2_ = 0;
  local_338[6] = '\0';
  local_338[7] = '\0';
  aStack_330._M_local_buf[0] = (char)aStack_330._8_8_;
  aStack_330._1_2_ = (undefined2)((ulong)aStack_330._8_8_ >> 8);
  aStack_330._M_local_buf[3] = (char)((ulong)aStack_330._8_8_ >> 0x18);
  aStack_330._4_2_ = (undefined2)((ulong)aStack_330._8_8_ >> 0x20);
  aStack_330._M_local_buf[6] = (char)((ulong)aStack_330._8_8_ >> 0x30);
  aStack_330._M_local_buf[7] = (char)((ulong)aStack_330._8_8_ >> 0x38);
  local_320 = 0;
  pcVar29 = glu::getGLSLVersionDeclaration(bVar17 | GLSL_VERSION_310_ES);
  local_5e8._0_4_ = sBGRA;
  local_5e8._4_4_ = SNORM_INT8;
  _Var30._M_p = (pointer)std::__cxx11::string::_M_create
                                   ((ulong *)&stack0xfffffffffffff978,(ulong)local_5e8);
  builtin_strncpy(_Var30._M_p,"GLSL_VERSION_DECL",0x11);
  cVar18 = (char)local_5e8._0_8_;
  uVar81 = SUB87(local_5e8._0_8_,1);
  _Var30._M_p[local_5e8._0_8_] = '\0';
  uVar82 = local_5e8._0_8_;
  pmVar31 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_348,(key_type *)&stack0xfffffffffffff978);
  pcVar45 = (char *)pmVar31->_M_string_length;
  strlen(pcVar29);
  std::__cxx11::string::_M_replace((ulong)pmVar31,0,pcVar45,(ulong)pcVar29);
  if (_Var30._M_p != &stack0xfffffffffffff988) {
    operator_delete(_Var30._M_p,uVar82 + 1);
  }
  local_5a8._0_8_ = &local_598;
  local_578._M_dataplus._M_p = (pointer)0xbb;
  __dest = (void *)std::__cxx11::string::_M_create((ulong *)local_5a8,(ulong)&local_578);
  _Var80._M_p = local_578._M_dataplus._M_p;
  local_5a8._0_8_ = __dest;
  local_598._M_allocated_capacity = (size_type)local_578._M_dataplus._M_p;
  memcpy(__dest,
         "${GLSL_VERSION_DECL}\nlayout(location=0) in highp vec2 i_coord;\nout highp vec2 v_color;\nvoid main (void)\n{\n\tv_color = 0.5 * (vec2(1.0) + i_coord);\n\tgl_Position = vec4(i_coord, 0.0, 1.0);\n}"
         ,0xbb);
  local_5a8._8_8_ = _Var80._M_p;
  *((long)__dest + _Var80._M_p) = '\0';
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_5e8,(string *)local_5a8);
  tcu::StringTemplate::specialize
            ((string *)&stack0xfffffffffffff978,(StringTemplate *)local_5e8,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_348);
  local_618._0_8_ = (ulong)(uint)local_618._4_4_ << 0x20;
  local_618._8_8_ = &aStack_600;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_618 + 8),_Var30._M_p,_Var30._M_p + CONCAT71(uVar81,cVar18));
  if (_Var30._M_p != &stack0xfffffffffffff988) {
    operator_delete(_Var30._M_p,uVar82 + 1);
  }
  tcu::StringTemplate::~StringTemplate((StringTemplate *)local_5e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a8._0_8_ != &local_598) {
    operator_delete((void *)local_5a8._0_8_,local_598._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_348);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_548 + (local_618._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_618 + 8));
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_348);
  CVar22.super_ApiType.m_bits = (ApiType)(*local_580->_vptr_RenderContext[2])();
  bVar17 = glu::contextSupports(CVar22,(ApiType)0x23);
  uVar39 = (undefined4)((ulong)lVar46 >> 0x20);
  GVar78 = CONCAT31((int3)((ulong)lVar46 >> 8),bVar17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_348,"${GLSL_VERSION_DECL}\n",0x15);
  _Var30._M_p = (pointer)0x0;
  pbVar35 = (postCommonBlendState->enableBlend).m_ptr;
  if (pbVar35 != (bool *)0x0) {
    _Var30._M_p = &stack0xfffffffffffff980;
    cVar18 = *pbVar35;
  }
  uVar82 = (BlendState *)0x0;
  pEVar5 = (postCommonBlendState->blendEq).m_ptr;
  if (pEVar5 != (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>
                 *)0x0) {
    uVar82 = &stack0xfffffffffffff990;
    in_stack_fffffffffffff990 = pEVar5->m_isFirst;
    in_stack_fffffffffffff998.m_align = (deUint64)&local_660;
    if ((bool)in_stack_fffffffffffff990 == true) {
      local_660.rgb = ((pEVar5->field_1).m_second)->rgb;
    }
    else {
      local_660 = *(pEVar5->field_1).m_second;
    }
  }
  local_658.m_align = 0;
  pEVar6 = (postCommonBlendState->blendFunc).m_ptr;
  if (pEVar6 != (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                 *)0x0) {
    local_658.m_align = (deUint64)(local_658.m_data + 8);
    local_658.m_data[8] = pEVar6->m_isFirst;
    local_658._16_8_ = &local_640;
    pBVar7 = (pEVar6->field_1).m_first;
    if ((bool)local_658.m_data[8] == true) {
      local_640 = *pBVar7;
    }
    else {
      local_640 = *pBVar7;
      aStack_638.m_align = (deUint64)pBVar7[1];
    }
  }
  uVar84 = local_658.m_align;
  aStack_638._8_8_ = (deUint8 *)0x0;
  pVVar8 = (postCommonBlendState->colorMask).m_ptr;
  if (pVVar8 != (Vector<bool,_4> *)0x0) {
    aStack_638._8_8_ = aStack_638.m_data + 0x10;
    lVar46 = 0;
    do {
      local_618[lVar46 + -0x10] = pVVar8->m_data[lVar46];
      lVar46 = lVar46 + 1;
    } while (lVar46 != 4);
  }
  post.enableBlend._4_12_ = in_stack_fffffffffffff93c;
  post.enableBlend.m_ptr._0_4_ = in_stack_fffffffffffff938;
  post.blendEq.m_ptr =
       (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)
       drawBuffers;
  post.blendEq.field_1.m_align._0_4_ = GVar78;
  post.blendEq.field_1.m_align._4_4_ = uVar39;
  post.blendEq.field_1._8_4_ = (ChannelOrder)log;
  post.blendEq.field_1._12_4_ = SUB84(log,4);
  post.blendEq.field_1._16_8_ = postCommonBlendState;
  post.blendFunc.m_ptr =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)pFVar24;
  post.blendFunc.field_1.m_align = in_stack_fffffffffffff970;
  post.blendFunc.field_1._8_8_ = _Var30._M_p;
  post.blendFunc.field_1.m_data[0x10] = cVar18;
  post.blendFunc.field_1._17_7_ = uVar81;
  post.blendFunc.field_1._24_8_ = uVar82;
  post.colorMask.m_ptr._0_1_ = in_stack_fffffffffffff990;
  post.colorMask.m_ptr._1_7_ = in_stack_fffffffffffff991;
  post.colorMask.field_1.m_align = in_stack_fffffffffffff998.m_align;
  uVar83 = uVar82;
  bVar17 = requiresAdvancedBlendEq
                     ((anon_unknown_0 *)(local_5b0->blendEq).m_ptr,(BlendState *)uVar82,post,
                      (vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                       *)(drawBuffers->
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                         )._M_impl.super__Vector_impl_data._M_start);
  if ((deUint8 *)uVar84 != (deUint8 *)0x0) {
    *(deUint8 *)uVar84 = '\x01';
    pdVar1 = (deUint8 *)(uVar84 + 8);
    pdVar1[0] = '\0';
    pdVar1[1] = '\0';
    pdVar1[2] = '\0';
    pdVar1[3] = '\0';
    pdVar1[4] = '\0';
    pdVar1[5] = '\0';
    pdVar1[6] = '\0';
    pdVar1[7] = '\0';
    uVar82 = uVar83;
  }
  if ((BlendState *)uVar82 != (BlendState *)0x0) {
    *(undefined1 *)&(((BlendState *)uVar82)->enableBlend).m_ptr = 1;
    (((BlendState *)uVar82)->enableBlend).field_1.m_align = 0;
  }
  if (bVar17) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_348,"${GLSL_EXTENSION}",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_348,"layout(blend_support_all_equations) out;\n",0x29);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_348,"in highp vec2 v_color;\n",0x17);
  pDVar28 = (drawBuffers->
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(drawBuffers->
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pDVar28) >> 7)) {
    lVar49 = 0x10;
    lVar46 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_348,"layout(location=",0x10);
      poVar32 = (ostream *)std::ostream::operator<<((ostream *)local_348,(int)lVar46);
      std::__ostream_insert<char,std::char_traits<char>>(poVar32,") out highp ",0xc);
      TVar21 = tcu::getTextureChannelClass
                         (*(ChannelType *)((long)(pDVar28->m_size).m_data + lVar49 + -4));
      if (TVar21 < TEXTURECHANNELCLASS_LAST) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_348,&DAT_01c92998 + *(int *)(&DAT_01c92998 + (ulong)TVar21 * 4),
                   *(long *)(&DAT_01c929b0 + (ulong)TVar21 * 8));
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348," o_drawBuffer",0xd);
      poVar32 = (ostream *)std::ostream::operator<<((ostream *)local_348,(int)lVar46);
      std::__ostream_insert<char,std::char_traits<char>>(poVar32,";\n",2);
      lVar46 = lVar46 + 1;
      pDVar28 = (drawBuffers->
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar49 = lVar49 + 0x80;
    } while (lVar46 < (int)((ulong)((long)(drawBuffers->
                                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)pDVar28) >> 7));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,"{\n",2);
  pDVar28 = (drawBuffers->
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(drawBuffers->
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pDVar28) >> 7)) {
    lVar46 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,"\to_drawBuffer",0xd);
      uVar23 = (uint)lVar46;
      std::ostream::operator<<((ostream *)local_348,uVar23);
      TVar21 = tcu::getTextureChannelClass(pDVar28[lVar46].m_format.type);
      switch(TVar21) {
      case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
      case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
      case TEXTURECHANNELCLASS_FLOATING_POINT:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348," = vec4(",8);
        pcVar45 = (&PTR_anon_var_dwarf_3ffbf30_021716e0)[uVar23 & 3];
        sVar33 = strlen(pcVar45);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,pcVar45,sVar33);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,", ",2);
        pcVar45 = (&PTR_anon_var_dwarf_3ffbf30_021716e0)[uVar23 + 1 & 3];
        sVar33 = strlen(pcVar45);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,pcVar45,sVar33);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,", ",2);
        uVar38 = uVar23 + 5;
        if (-1 < (int)(uVar23 + 2)) {
          uVar38 = uVar23 + 2;
        }
        pcVar45 = (&PTR_anon_var_dwarf_3ffbf30_021716e0)
                  [(int)((uVar23 - (uVar38 & 0xfffffffc)) + 2)];
        sVar33 = strlen(pcVar45);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,pcVar45,sVar33);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,", ",2);
        uVar38 = uVar23 + 6;
        if (-1 < (int)(uVar23 + 3)) {
          uVar38 = uVar23 + 3;
        }
        pcVar45 = (&PTR_anon_var_dwarf_3ffbf30_021716e0)
                  [(int)((uVar23 - (uVar38 & 0xfffffffc)) + 3)];
        sVar33 = strlen(pcVar45);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,pcVar45,sVar33);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,");\n",3);
        break;
      case TEXTURECHANNELCLASS_SIGNED_INTEGER:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348," = ivec4(int(",0xd)
        ;
        pcVar45 = (&PTR_anon_var_dwarf_3ffbf30_021716e0)[uVar23 & 3];
        sVar33 = strlen(pcVar45);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,pcVar45,sVar33);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,"), int(",7);
        pcVar45 = (&PTR_anon_var_dwarf_3ffbf30_021716e0)[uVar23 + 1 & 3];
        sVar33 = strlen(pcVar45);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,pcVar45,sVar33);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,"), int(",7);
        uVar38 = uVar23 + 5;
        if (-1 < (int)(uVar23 + 2)) {
          uVar38 = uVar23 + 2;
        }
        pcVar45 = (&PTR_anon_var_dwarf_3ffbf30_021716e0)
                  [(int)((uVar23 - (uVar38 & 0xfffffffc)) + 2)];
        sVar33 = strlen(pcVar45);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,pcVar45,sVar33);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,"), int(",7);
        uVar38 = uVar23 + 6;
        if (-1 < (int)(uVar23 + 3)) {
          uVar38 = uVar23 + 3;
        }
        pcVar45 = (&PTR_anon_var_dwarf_3ffbf30_021716e0)
                  [(int)((uVar23 - (uVar38 & 0xfffffffc)) + 3)];
        sVar33 = strlen(pcVar45);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,pcVar45,sVar33);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,"));\n",4);
        break;
      case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_348," = uvec4(uint(",0xe);
        pcVar45 = (&PTR_anon_var_dwarf_3ffbf30_021716e0)[uVar23 & 3];
        sVar33 = strlen(pcVar45);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,pcVar45,sVar33);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,"), uint(",8);
        pcVar45 = (&PTR_anon_var_dwarf_3ffbf30_021716e0)[uVar23 + 1 & 3];
        sVar33 = strlen(pcVar45);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,pcVar45,sVar33);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,"), uint(",8);
        uVar38 = uVar23 + 5;
        if (-1 < (int)(uVar23 + 2)) {
          uVar38 = uVar23 + 2;
        }
        pcVar45 = (&PTR_anon_var_dwarf_3ffbf30_021716e0)
                  [(int)((uVar23 - (uVar38 & 0xfffffffc)) + 2)];
        sVar33 = strlen(pcVar45);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,pcVar45,sVar33);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,"), uint(",8);
        uVar38 = uVar23 + 6;
        if (-1 < (int)(uVar23 + 3)) {
          uVar38 = uVar23 + 3;
        }
        pcVar45 = (&PTR_anon_var_dwarf_3ffbf30_021716e0)
                  [(int)((uVar23 - (uVar38 & 0xfffffffc)) + 3)];
        sVar33 = strlen(pcVar45);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,pcVar45,sVar33);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,"));\n",4);
      }
      lVar46 = lVar46 + 1;
      pDVar28 = (drawBuffers->
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (lVar46 < (int)((ulong)((long)(drawBuffers->
                                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)pDVar28) >> 7));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,"}",1);
  cVar77 = (char)GVar78;
  local_5d8._8_8_ = local_5e8 + 8;
  stack0xfffffffffffffa20 = (TextureFormat)((ulong)uStack_5dc << 0x20);
  local_5d8._M_allocated_capacity = 0;
  local_5c0 = (pointer)0x0;
  local_5c8 = (_Base_ptr)local_5d8._8_8_;
  pcVar29 = glu::getGLSLVersionDeclaration(GVar78 & 0xff | GLSL_VERSION_310_ES);
  paVar41 = &local_578.field_2;
  local_188._0_8_ = 0x11;
  local_578._M_dataplus._M_p = (pointer)paVar41;
  local_578._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_578,(ulong)&local_188);
  local_578.field_2._M_allocated_capacity._0_6_ = local_188._0_6_;
  local_578.field_2._M_allocated_capacity._6_2_ = local_188._6_2_;
  builtin_strncpy(local_578._M_dataplus._M_p,"GLSL_VERSION_DECL",0x11);
  local_578._M_string_length = local_188._0_8_;
  local_578._M_dataplus._M_p[local_188._0_8_] = '\0';
  pmVar31 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_5e8,&local_578);
  pcVar45 = (char *)pmVar31->_M_string_length;
  strlen(pcVar29);
  std::__cxx11::string::_M_replace((ulong)pmVar31,0,pcVar45,(ulong)pcVar29);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_578._M_dataplus._M_p != paVar41) {
    operator_delete(local_578._M_dataplus._M_p,
                    CONCAT26(local_578.field_2._M_allocated_capacity._6_2_,
                             local_578.field_2._M_allocated_capacity._0_6_) + 1);
  }
  local_578.field_2._M_allocated_capacity._0_6_ = 0x455f4c534c47;
  local_578.field_2._M_allocated_capacity._6_2_ = 0x5458;
  local_578.field_2._8_6_ = 0x4e4f49534e45;
  local_578._M_string_length = 0xe;
  local_578.field_2._M_local_buf[0xe] = '\0';
  local_578._M_dataplus._M_p = (pointer)paVar41;
  pmVar31 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_5e8,&local_578);
  pcVar45 = "#extension GL_KHR_blend_equation_advanced : require\n";
  if (cVar77 != '\0') {
    pcVar45 = "\n";
  }
  std::__cxx11::string::_M_replace
            ((ulong)pmVar31,0,(char *)pmVar31->_M_string_length,(ulong)pcVar45);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_578._M_dataplus._M_p != paVar41) {
    operator_delete(local_578._M_dataplus._M_p,
                    CONCAT26(local_578.field_2._M_allocated_capacity._6_2_,
                             local_578.field_2._M_allocated_capacity._0_6_) + 1);
  }
  std::__cxx11::stringbuf::str();
  tcu::StringTemplate::StringTemplate((StringTemplate *)&local_188,&local_388);
  tcu::StringTemplate::specialize
            (&local_578,(StringTemplate *)&local_188,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_5e8);
  local_5a8._0_4_ = 1;
  local_5a8._8_8_ = local_598._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_5a8 + 8),local_578._M_dataplus._M_p,
             (undefined1 *)(local_578._M_string_length + (long)local_578._M_dataplus._M_p));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_578._M_dataplus._M_p != paVar41) {
    operator_delete(local_578._M_dataplus._M_p,
                    CONCAT26(local_578.field_2._M_allocated_capacity._6_2_,
                             local_578.field_2._M_allocated_capacity._0_6_) + 1);
  }
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&local_188);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_5e8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_348);
  std::ios_base::~ios_base(local_2d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_548 + (ulong)(uint)local_5a8._0_4_ * 0x18),(value_type *)(local_5a8 + 8));
  lVar46 = 0;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_458 + lVar46),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_548 + lVar46));
    lVar46 = lVar46 + 0x18;
  } while (lVar46 != 0x90);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::vector
            ((vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *)
             &local_3c8,&vStack_4b8);
  BStack_3b0.src = local_4a0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_3a8,&local_498);
  local_390 = (bool)(undefined1)uStack_480;
  if ((char *)local_5a8._8_8_ != local_598._M_local_buf + 8) {
    operator_delete((void *)local_5a8._8_8_,local_598._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._8_8_ != &aStack_600) {
    operator_delete((void *)local_618._8_8_,aStack_600._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_498);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&vStack_4b8);
  lVar46 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_548 + lVar46));
    lVar46 = lVar46 + -0x18;
  } while (lVar46 != -0x18);
  glu::ShaderProgram::ShaderProgram(&local_118,pFVar24,(ProgramSources *)local_458);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_3a8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            ((vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *)
             &local_3c8);
  lVar46 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_458 + lVar46));
    lVar46 = lVar46 + -0x18;
  } while (lVar46 != -0x18);
  pDVar28 = (drawBuffers->
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
            )._M_impl.super__Vector_impl_data._M_start;
  iVar19 = (pDVar28->m_size).m_data[0];
  GVar4 = (pDVar28->m_size).m_data[1];
  _Var30._M_p = (pointer)0x0;
  pbVar35 = (postCommonBlendState->enableBlend).m_ptr;
  if (pbVar35 != (bool *)0x0) {
    _Var30._M_p = &stack0xfffffffffffff980;
    cVar18 = *pbVar35;
  }
  uVar82 = (BlendState *)0x0;
  pEVar5 = (postCommonBlendState->blendEq).m_ptr;
  if (pEVar5 != (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>
                 *)0x0) {
    uVar82 = &stack0xfffffffffffff990;
    in_stack_fffffffffffff990 = pEVar5->m_isFirst;
    in_stack_fffffffffffff998.m_align = (deUint64)&local_660;
    if ((bool)in_stack_fffffffffffff990 == true) {
      local_660.rgb = ((pEVar5->field_1).m_second)->rgb;
    }
    else {
      local_660 = *(pEVar5->field_1).m_second;
    }
  }
  local_658.m_align = 0;
  pEVar6 = (postCommonBlendState->blendFunc).m_ptr;
  if (pEVar6 != (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                 *)0x0) {
    local_658.m_align = (deUint64)(local_658.m_data + 8);
    local_658.m_data[8] = pEVar6->m_isFirst;
    local_658._16_8_ = &local_640;
    pBVar7 = (pEVar6->field_1).m_first;
    if ((bool)local_658.m_data[8] == true) {
      local_640 = *pBVar7;
    }
    else {
      local_640 = *pBVar7;
      aStack_638.m_align = (deUint64)pBVar7[1];
    }
  }
  uVar84 = local_658.m_align;
  aStack_638._8_8_ = (deUint8 *)0x0;
  pVVar8 = (postCommonBlendState->colorMask).m_ptr;
  if (pVVar8 != (Vector<bool,_4> *)0x0) {
    aStack_638._8_8_ = aStack_638.m_data + 0x10;
    lVar46 = 0;
    do {
      local_618[lVar46 + -0x10] = pVVar8->m_data[lVar46];
      lVar46 = lVar46 + 1;
    } while (lVar46 != 4);
  }
  pDVar36 = (drawBuffers->
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  post_00.enableBlend._4_12_ = in_stack_fffffffffffff93c;
  post_00.enableBlend.m_ptr._0_4_ = in_stack_fffffffffffff938;
  post_00.blendEq.m_ptr =
       (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *)
       drawBuffers;
  post_00.blendEq.field_1.m_align._0_4_ = iVar19;
  post_00.blendEq.field_1.m_align._4_4_ = uVar39;
  post_00.blendEq.field_1._8_4_ = (ChannelOrder)log;
  post_00.blendEq.field_1._12_4_ = SUB84(log,4);
  post_00.blendEq.field_1._16_8_ = postCommonBlendState;
  post_00.blendFunc.m_ptr =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)pFVar24;
  post_00.blendFunc.field_1.m_align = in_stack_fffffffffffff970;
  post_00.blendFunc.field_1._8_8_ = _Var30._M_p;
  post_00.blendFunc.field_1.m_data[0x10] = cVar18;
  post_00.blendFunc.field_1._17_7_ = uVar81;
  post_00.blendFunc.field_1._24_8_ = uVar82;
  post_00.colorMask.m_ptr._0_1_ = in_stack_fffffffffffff990;
  post_00.colorMask.m_ptr._1_7_ = in_stack_fffffffffffff991;
  post_00.colorMask.field_1.m_align = in_stack_fffffffffffff998.m_align;
  uVar83 = uVar82;
  cVar18 = requiresAdvancedBlendEq
                     ((anon_unknown_0 *)(local_5b0->blendEq).m_ptr,(BlendState *)uVar82,post_00,
                      (vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                       *)pDVar28);
  if ((deUint8 *)uVar84 != (deUint8 *)0x0) {
    *(deUint8 *)uVar84 = '\x01';
    pdVar1 = (deUint8 *)(uVar84 + 8);
    pdVar1[0] = '\0';
    pdVar1[1] = '\0';
    pdVar1[2] = '\0';
    pdVar1[3] = '\0';
    pdVar1[4] = '\0';
    pdVar1[5] = '\0';
    pdVar1[6] = '\0';
    pdVar1[7] = '\0';
    uVar82 = uVar83;
  }
  if ((BlendState *)uVar82 != (BlendState *)0x0) {
    *(undefined1 *)&(((BlendState *)uVar82)->enableBlend).m_ptr = 1;
    (((BlendState *)uVar82)->enableBlend).field_1.m_align = 0;
    pDVar28 = (drawBuffers->
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pDVar36 = (drawBuffers->
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  }
  local_388._M_dataplus._M_p = (pointer)0x0;
  local_388._M_string_length = 0;
  local_388.field_2._M_allocated_capacity = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_388,
             (long)pDVar36 - (long)pDVar28 >> 7);
  uVar23 = (uint)(local_388._M_string_length - (long)local_388._M_dataplus._M_p >> 2);
  if (0 < (int)uVar23) {
    pDVar28 = (drawBuffers->
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
              )._M_impl.super__Vector_impl_data._M_start;
    uVar40 = 0;
    do {
      iVar51 = (int)uVar40 + 0x8ce0;
      if (pDVar28->m_render == false) {
        iVar51 = 0;
      }
      *(int *)(local_388._M_dataplus._M_p + uVar40 * 4) = iVar51;
      uVar40 = uVar40 + 1;
      pDVar28 = pDVar28 + 1;
    } while ((uVar23 & 0x7fffffff) != uVar40);
  }
  pFVar79 = pFVar24;
  glu::operator<<(log,&local_118);
  (*pFVar24->viewport)(0,0,iVar19,GVar4);
  (*pFVar24->useProgram)(local_118.m_program.m_program);
  (*pFVar24->bindFramebuffer)(0x8d40,local_160.m_object);
  setCommonBlendState(pFVar24,local_5b0);
  uVar23 = (uint)(byte)cVar18;
  pDVar28 = (drawBuffers->
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(drawBuffers->
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pDVar28) >> 7)) {
    lVar46 = 0x18;
    lVar49 = 0;
    pp_Var2 = &pFVar79->disablei;
    pp_Var52 = &pFVar79->enablei;
    do {
      pcVar45 = *(char **)((long)(pDVar28->m_size).m_data + lVar46 + -4);
      GVar48 = (GLuint)lVar49;
      if (pcVar45 != (char *)0x0) {
        pp_Var34 = pp_Var2;
        if (*pcVar45 != '\0') {
          pp_Var34 = pp_Var52;
        }
        (**pp_Var34)(0xbe2,GVar48);
      }
      pGVar9 = *(GLboolean **)((long)(&pDVar28->m_size + 10) + lVar46 + 4);
      if (pGVar9 != (GLboolean *)0x0) {
        (*pFVar79->colorMaski)(GVar48,*pGVar9,pGVar9[1],pGVar9[2],pGVar9[3]);
      }
      pcVar45 = *(char **)((long)&((TextureFormat *)(&pDVar28->m_size + 1))->type + lVar46);
      if (pcVar45 != (char *)0x0) {
        GVar50 = **(GLenum **)(pcVar45 + 8);
        if (*pcVar45 == '\x01') {
          (*pFVar79->blendEquationi)(GVar48,GVar50);
        }
        else {
          (*pFVar79->blendEquationSeparatei)(GVar48,GVar50,(*(GLenum **)(pcVar45 + 8))[1]);
        }
      }
      pcVar45 = *(char **)((long)(&pDVar28->m_size + 5) + lVar46 + 4);
      if (pcVar45 != (char *)0x0) {
        pGVar10 = *(GLenum **)(pcVar45 + 8);
        if (*pcVar45 == '\x01') {
          (*pFVar79->blendFunci)(GVar48,*pGVar10,pGVar10[1]);
        }
        else {
          (*pFVar79->blendFuncSeparatei)(GVar48,*pGVar10,pGVar10[1],pGVar10[2],pGVar10[3]);
        }
      }
      GVar50 = (*pFVar79->getError)();
      glu::checkError(GVar50,"Failed to set draw buffer specifig blend state.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawBuffersIndexedTests.cpp"
                      ,0x10e);
      cVar18 = (char)uVar23;
      lVar49 = lVar49 + 1;
      pDVar28 = (drawBuffers->
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar46 = lVar46 + 0x80;
    } while (lVar49 < (int)((ulong)((long)(drawBuffers->
                                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)pDVar28) >> 7));
  }
  setCommonBlendState(pFVar79,postCommonBlendState);
  (*pFVar79->drawBuffers)
            ((GLsizei)(local_388._M_string_length - (long)local_388._M_dataplus._M_p >> 2),
             (GLenum *)local_388._M_dataplus._M_p);
  if (cVar18 != '\0') {
    (*pFVar79->blendBarrier)();
  }
  local_348 = (undefined1  [8])((ulong)local_348 & 0xffffffff00000000);
  local_338._0_4_ = 0;
  local_338._4_2_ = 0;
  local_338[6] = '\0';
  local_338[7] = '\0';
  aStack_330._M_local_buf[0] = '\0';
  local_320 = local_320 & 0xffffffff00000000;
  local_318[0].componentType = VTX_COMP_FLOAT;
  local_318[0].convert = VTX_COMP_CONVERT_NONE;
  local_318[0].numComponents = 2;
  local_318[0].numElements = 6;
  local_318[0].stride = 0;
  local_318[0].data = Functional::(anonymous_namespace)::s_quadCoords;
  TStack_540.order = 3;
  local_548 = (undefined1  [8])0x600000000;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_538._8_8_;
  local_538._0_16_ = auVar13 << 0x40;
  auStack_340 = (undefined1  [8])(local_338 + 8);
  glu::draw(local_580,local_118.m_program.m_program,1,(VertexArrayBinding *)local_348,
            (PrimitiveList *)local_548,(DrawUtilCallback *)0x0);
  if (auStack_340 != (undefined1  [8])(local_338 + 8)) {
    operator_delete((void *)auStack_340,
                    CONCAT17(aStack_330._M_local_buf[7],
                             CONCAT16(aStack_330._M_local_buf[6],
                                      CONCAT24(aStack_330._4_2_,
                                               CONCAT13(aStack_330._M_local_buf[3],
                                                        CONCAT21(aStack_330._1_2_,
                                                                 aStack_330._M_local_buf[0]))))) + 1
                   );
  }
  if (cVar18 != '\0') {
    (*pFVar79->blendBarrier)();
  }
  (*pFVar79->drawBuffers)(0,(GLenum *)0x0);
  (*pFVar79->bindFramebuffer)(0x8d40,0);
  (*pFVar79->useProgram)(0);
  GVar50 = (*pFVar79->getError)();
  glu::checkError(GVar50,"Failed to render",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawBuffersIndexedTests.cpp"
                  ,0x414);
  rr::Renderer::Renderer((Renderer *)&local_1c8);
  rr::PrimitiveList::PrimitiveList(&local_188,PRIMITIVETYPE_TRIANGLES,6,0);
  local_588 = 0;
  local_5a8 = ZEXT816(0x200000000);
  local_598 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               )ZEXT816(0x1c92780);
  pDVar28 = (drawBuffers->
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pDVar36 = (drawBuffers->
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)pDVar36 - (long)pDVar28) >> 7)) {
    this = (FragmentOperationState *)(local_538 + 8);
    lVar46 = 0;
    do {
      if (pDVar28[lVar46].m_render == true) {
        uVar82 = *(undefined8 *)pDVar28[lVar46].m_size.m_data;
        _local_548 = ZEXT816(0x100000000);
        local_538._0_8_ = 0x200000001;
        rr::FragmentOperationState::FragmentOperationState(this);
        local_498.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
        local_498.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0x3f8000;
        local_498.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        local_498.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (undefined4)uVar82;
        uStack_480 = (uint)((ulong)uVar82 >> 0x20);
        uStack_47c = 0x3f80000000000000;
        local_474 = 0x3f800000;
        local_470 = 0;
        local_46c = 0xffffffff;
        local_538._4_4_ = 0;
        local_4d4 = 1;
        setBlendState(this,local_5b0);
        setBlendState(this,&pDVar28[lVar46].m_blendState);
        setBlendState(this,postCommonBlendState);
        pbVar35 = (postCommonBlendState->enableBlend).m_ptr;
        if (((pbVar35 == (bool *)0x0) &&
            (pbVar35 = pDVar28[lVar46].m_blendState.enableBlend.m_ptr, pbVar35 == (bool *)0x0)) &&
           (pbVar35 = (local_5b0->enableBlend).m_ptr, pbVar35 == (bool *)0x0)) {
          uVar39 = 0;
        }
        else {
          uVar39 = 0;
          if (*pbVar35 != false) {
            uVar39 = local_4d4;
          }
        }
        local_4d4 = uVar39;
        TVar21 = tcu::getTextureChannelClass(pDVar28[lVar46].m_format.type);
        if (((TVar21 != TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) &&
            (TVar21 = tcu::getTextureChannelClass(pDVar28[lVar46].m_format.type),
            TVar21 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT)) &&
           (TVar21 = tcu::getTextureChannelClass(pDVar28[lVar46].m_format.type),
           TVar21 != TEXTURECHANNELCLASS_FLOATING_POINT)) {
          local_4d4 = 0;
        }
        tcu::TextureLevel::getAccess
                  ((PixelBufferAccess *)local_5e8,
                   local_1a0.
                   super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>._M_impl
                   .super__Vector_impl_data._M_start + lVar46);
        rr::MultisamplePixelBufferAccess::fromSinglesampleAccess
                  ((MultisamplePixelBufferAccess *)local_458,(PixelBufferAccess *)local_5e8);
        rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess
                  ((MultisamplePixelBufferAccess *)local_618);
        rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess
                  ((MultisamplePixelBufferAccess *)&local_578);
        rr::RenderTarget::RenderTarget
                  ((RenderTarget *)local_348,(MultisamplePixelBufferAccess *)local_458,
                   (MultisamplePixelBufferAccess *)local_618,
                   (MultisamplePixelBufferAccess *)&local_578);
        rr::VertexShader::VertexShader((VertexShader *)local_5e8,1,1);
        local_5e8._0_8_ = &PTR_shadeVertices_02171710;
        *(undefined4 *)stack0xfffffffffffffa20 = 0;
        local_5c8->_M_color = _S_red;
        pDVar28 = (drawBuffers->
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                  )._M_impl.super__Vector_impl_data._M_start + lVar46;
        rr::FragmentShader::FragmentShader((FragmentShader *)local_458,1,1);
        local_458 = (undefined1  [8])&PTR_shadeFragments_02171740;
        local_420 = (undefined4)lVar46;
        local_418 = pDVar28->m_render;
        local_414 = (pDVar28->m_size).m_data[0];
        local_410 = (pDVar28->m_size).m_data[1];
        local_40c = pDVar28->m_format;
        local_400 = (pointer)0x0;
        pbVar35 = (pDVar28->m_blendState).enableBlend.m_ptr;
        if (pbVar35 != (bool *)0x0) {
          local_3f8[0] = *pbVar35;
          local_400 = (pointer)local_3f8;
        }
        local_3f8._8_8_ = (pointer)0x0;
        pEVar5 = (pDVar28->m_blendState).blendEq.m_ptr;
        if (pEVar5 != (Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>
                       *)0x0) {
          local_3f8[0x10] = pEVar5->m_isFirst;
          if ((bool)local_3f8[0x10] == true) {
            local_3d8._M_allocated_capacity._0_4_ = ((pEVar5->field_1).m_second)->rgb;
          }
          else {
            local_3d8._M_allocated_capacity = (size_type)*(pEVar5->field_1).m_second;
          }
          local_3f8._24_8_ = &local_3d8;
          local_3f8._8_8_ = local_3f8 + 0x10;
        }
        local_3d8._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        pEVar6 = (pDVar28->m_blendState).blendFunc.m_ptr;
        if (pEVar6 != (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                       *)0x0) {
          local_3c8._M_local_buf[0] = pEVar6->m_isFirst;
          pBVar7 = (pEVar6->field_1).m_first;
          if ((bool)local_3c8._M_local_buf[0] == true) {
            local_3b8 = *pBVar7;
          }
          else {
            local_3b8 = *pBVar7;
            BStack_3b0 = pBVar7[1];
          }
          local_3c8._8_8_ = &local_3b8;
          local_3d8._8_8_ = &local_3c8;
        }
        local_3a8._0_8_ = (pointer)0x0;
        pVVar8 = (pDVar28->m_blendState).colorMask.m_ptr;
        if (pVVar8 != (Vector<bool,_4> *)0x0) {
          lVar49 = 0;
          do {
            local_3a8[lVar49 + 8] = pVVar8->m_data[lVar49];
            lVar49 = lVar49 + 1;
          } while (lVar49 != 4);
          local_3a8._0_8_ = local_3a8 + 8;
        }
        *(undefined4 *)TStack_450 = 0;
        TVar21 = tcu::getTextureChannelClass(local_40c.type);
        if (TVar21 < TEXTURECHANNELCLASS_LAST) {
          *(undefined4 *)&(local_438->_M_dataplus)._M_p =
               *(undefined4 *)(&DAT_01c929d8 + (ulong)TVar21 * 4);
        }
        local_578._M_string_length = (size_type)local_458;
        local_578.field_2._M_allocated_capacity._0_6_ = 0;
        local_578.field_2._M_allocated_capacity._6_2_ = 0;
        local_618._0_8_ = local_548;
        local_618._8_8_ = local_348;
        aStack_600._M_allocated_capacity._0_4_ = 1;
        aStack_600._8_8_ = local_5a8;
        local_5f0 = &local_188;
        local_608 = &local_578;
        local_578._M_dataplus._M_p = (pointer)local_5e8;
        rr::Renderer::draw((Renderer *)&local_1c8,(DrawCommand *)local_618);
        local_458 = (undefined1  [8])&PTR_shadeFragments_02171740;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8._8_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          *(char *)local_3d8._8_8_ = '\x01';
          pcVar45 = (char *)(local_3d8._8_8_ + 8);
          pcVar45[0] = '\0';
          pcVar45[1] = '\0';
          pcVar45[2] = '\0';
          pcVar45[3] = '\0';
          pcVar45[4] = '\0';
          pcVar45[5] = '\0';
          pcVar45[6] = '\0';
          pcVar45[7] = '\0';
        }
        if ((pointer)local_3f8._8_8_ != (pointer)0x0) {
          *(undefined1 *)&((_Alloc_hider *)local_3f8._8_8_)->_M_p = 1;
          *(size_type *)(local_3f8._8_8_ + 8) = 0;
        }
        rr::FragmentShader::~FragmentShader((FragmentShader *)local_458);
        rr::VertexShader::~VertexShader((VertexShader *)local_5e8);
        pDVar28 = (drawBuffers->
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pDVar36 = (drawBuffers->
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      }
      lVar46 = lVar46 + 1;
    } while (lVar46 < (int)((ulong)((long)pDVar36 - (long)pDVar28) >> 7));
  }
  rr::Renderer::~Renderer((Renderer *)&local_1c8);
  if (local_388._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_388._M_dataplus._M_p,
                    local_388.field_2._M_allocated_capacity - (long)local_388._M_dataplus._M_p);
  }
  glu::ShaderProgram::~ShaderProgram(&local_118);
  iVar19 = (*local_580->_vptr_RenderContext[3])();
  lVar46 = CONCAT44(extraout_var_01,iVar19);
  (**(code **)(lVar46 + 0x78))(0x8d40,local_160.m_object);
  if (0 < (int)((ulong)((long)local_140.m_objects.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_140.m_objects.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 2)) {
    lVar49 = 0;
    do {
      pTVar15 = local_1a0.super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
                _M_impl.super__Vector_impl_data._M_start;
      iVar19 = local_1a0.super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar49].m_size.m_data[0];
      iVar51 = local_1a0.super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar49].m_size.m_data[1];
      local_350 = local_1a0.
                  super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar49].m_format;
      TVar21 = tcu::getTextureChannelClass(local_350.type);
      local_348._0_4_ = RGBA;
      local_348._4_4_ = UNORM_INT8;
      if (TVar21 < TEXTURECHANNELCLASS_LAST) {
        local_348 = *(undefined1 (*) [8])(&DAT_01c929f0 + (ulong)TVar21 * 8);
      }
      tcu::TextureLevel::TextureLevel
                ((TextureLevel *)&local_118,(TextureFormat *)local_348,iVar19,iVar51,1);
      iVar19 = (int)lVar49;
      (**(code **)(lVar46 + 0x1218))(iVar19 + 0x8ce0);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)local_348,(TextureLevel *)&local_118);
      glu::readPixels(local_580,0,0,(PixelBufferAccess *)local_348);
      dVar20 = (**(code **)(lVar46 + 0x800))();
      glu::checkError(dVar20,"Reading pixels from renderbuffer failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawBuffersIndexedTests.cpp"
                      ,0x234);
      TVar21 = tcu::getTextureChannelClass(local_350.type);
      pTVar44 = pTVar15 + lVar49;
      if (TVar21 < TEXTURECHANNELCLASS_SIGNED_INTEGER) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_348);
        std::ostream::operator<<((ConstPixelBufferAccess *)local_348,iVar19);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_348);
        std::ios_base::~ios_base(local_2d8);
        pTVar26 = (TextureFormat *)
                  std::__cxx11::string::replace((ulong)local_548,0,(char *)0x0,0x1a1c8a4);
        local_618._0_8_ = &local_608;
        TVar47 = (TextureFormat)(pTVar26 + 2);
        if (*pTVar26 == TVar47) {
          local_608 = *(key_type **)TVar47;
          aStack_600._M_allocated_capacity = (size_type)pTVar26[3];
        }
        else {
          local_608 = *(key_type **)TVar47;
          local_618._0_8_ = *pTVar26;
        }
        local_618._8_8_ =
             *(anon_union_8_2_d0736028_for_Maybe<tcu::Vector<bool,_4>_>_2 *)(pTVar26 + 1);
        *pTVar26 = TVar47;
        pTVar26[1].order = R;
        pTVar26[1].type = SNORM_INT8;
        *(undefined1 *)&pTVar26[2].order = R;
        if (local_548 != (undefined1  [8])local_538) {
          operator_delete((void *)local_548,local_538._0_8_ + 1);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_348);
        std::ostream::operator<<((ConstPixelBufferAccess *)local_348,iVar19);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_348);
        std::ios_base::~ios_base(local_2d8);
        plVar27 = (long *)std::__cxx11::string::replace((ulong)local_548,0,(char *)0x0,0x1c9334c);
        local_5a8._0_8_ = &local_598;
        paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar27 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar27 == paVar41) {
          local_598 = *paVar41;
        }
        else {
          local_598._M_allocated_capacity = paVar41->_M_allocated_capacity;
          local_5a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar27;
        }
        local_5a8._8_8_ = plVar27[1];
        *plVar27 = (long)paVar41;
        plVar27[1] = 0;
        *(undefined1 *)(plVar27 + 2) = 0;
        if (local_548 != (undefined1  [8])local_538) {
          operator_delete((void *)local_548,local_538._0_8_ + 1);
        }
        local_148 = (TextureFormat)
                    local_118.m_shaders[0].
                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
        tcu::getTextureFormatBitDepth((tcu *)&local_578,&local_350);
        tcu::getTextureFormatBitDepth((tcu *)&local_188,&local_148);
        uVar82 = local_618._0_8_;
        local_458._0_4_ = A;
        local_458._4_4_ = SNORM_INT8;
        TStack_450.order = A;
        TStack_450.type = SNORM_INT8;
        local_448._M_allocated_capacity = (size_type)&DAT_00000001;
        local_448._8_8_ = 1;
        local_1c8 = ~-(uint)((int)(PrimitiveType)local_578._M_dataplus._M_p <
                            (int)local_188.m_primitiveType) & local_188.m_primitiveType |
                    (PrimitiveType)local_578._M_dataplus._M_p &
                    -(uint)((int)(PrimitiveType)local_578._M_dataplus._M_p <
                           (int)local_188.m_primitiveType);
        uStack_1c4 = ~-(uint)((int)local_578._M_dataplus._M_p._4_4_ < (int)local_188._4_4_) &
                     local_188._4_4_ |
                     local_578._M_dataplus._M_p._4_4_ &
                     -(uint)((int)local_578._M_dataplus._M_p._4_4_ < (int)local_188._4_4_);
        uStack_1c0 = ~-(uint)((int)(uint)local_578._M_string_length <
                             (int)(uint)local_188.m_numElements) & (uint)local_188.m_numElements |
                     (uint)local_578._M_string_length &
                     -(uint)((int)(uint)local_578._M_string_length <
                            (int)(uint)local_188.m_numElements);
        uStack_1bc = ~-(uint)((int)local_578._M_string_length._4_4_ <
                             (int)local_188.m_numElements._4_4_) & local_188.m_numElements._4_4_ |
                     local_578._M_string_length._4_4_ &
                     -(uint)((int)local_578._M_string_length._4_4_ <
                            (int)local_188.m_numElements._4_4_);
        _Var30._M_p = (pointer)0x0;
        uVar84 = 0;
        lVar53 = 0;
        do {
          uVar83 = *(undefined8 *)(&local_1c8 + lVar53);
          auVar58._8_4_ = (int)((ulong)uVar83 >> 0x20);
          auVar58._0_8_ = uVar83;
          auVar58._12_4_ = -(uint)((long)uVar83 < 0);
          *(ulong *)(&stack0xfffffffffffff978 + lVar53 * 8) =
               CONCAT44(-(uint)((int)uVar83 < 0),(int)uVar83);
          *(long *)(&stack0xfffffffffffff980 + lVar53 * 8) = auVar58._8_8_;
          lVar53 = lVar53 + 2;
        } while (lVar53 != 4);
        local_538._0_16_ = (undefined1  [16])0x0;
        _local_548 = (undefined1  [16])0x0;
        lVar53 = 0;
        do {
          TVar47 = (&TStack_450)[lVar53];
          auVar57 = *(undefined1 (*) [16])(&stack0xfffffffffffff978 + lVar53 * 8);
          auVar65._8_4_ = auVar57._8_4_;
          auVar65._12_4_ = auVar57._12_4_;
          auVar65._0_8_ = auVar57._8_8_;
          *(long *)(local_548 + lVar53 * 8) = *(long *)(local_458 + lVar53 * 8) << auVar57._0_8_;
          *(long *)(local_548 + lVar53 * 8 + 8) = (long)TVar47 << auVar65._8_8_;
          lVar53 = lVar53 + 2;
        } while (lVar53 != 4);
        local_5e8._0_4_ = A;
        local_5e8._4_4_ = SNORM_INT8;
        local_5e8._8_4_ = A;
        uStack_5dc = SNORM_INT8;
        local_5d8._M_allocated_capacity = (size_type)&DAT_00000001;
        local_5d8._8_8_ = &DAT_00000001;
        local_348._0_4_ = R;
        local_348._4_4_ = SNORM_INT8;
        auStack_340 = (undefined1  [8])0x0;
        local_338._0_4_ = 0;
        local_338._4_2_ = 0;
        local_338[6] = '\0';
        local_338[7] = '\0';
        aStack_330._M_local_buf[0] = '\0';
        aStack_330._1_2_ = 0;
        aStack_330._M_local_buf[3] = '\0';
        aStack_330._4_2_ = 0;
        aStack_330._M_local_buf[6] = '\0';
        aStack_330._M_local_buf[7] = '\0';
        lVar53 = 0;
        do {
          lVar54 = *(long *)(local_548 + lVar53 * 8 + 8);
          lVar11 = *(long *)(local_5e8 + lVar53 * 8 + 8);
          *(long *)(local_348 + lVar53 * 8) =
               *(long *)(local_548 + lVar53 * 8) - *(long *)(local_5e8 + lVar53 * 8);
          *(long *)(auStack_340 + lVar53 * 8) = lVar54 - lVar11;
          lVar53 = lVar53 + 2;
        } while (lVar53 != 4);
        local_388._M_dataplus._M_p = (pointer)0x0;
        local_388._M_string_length = 0;
        lVar53 = 0;
        do {
          *(ulong *)((long)&local_388._M_dataplus._M_p + lVar53 * 4) =
               CONCAT44((float)*(ulong *)(auStack_340 + lVar53 * 8),
                        (float)*(ulong *)(local_348 + lVar53 * 8));
          lVar53 = lVar53 + 2;
        } while (lVar53 != 4);
        local_48.m_data = (float  [4])divps(_DAT_01a356b0,(undefined1  [16])local_388._0_16_);
        uVar83 = local_5a8._0_8_;
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)local_348,pTVar44);
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)local_548,(TextureLevel *)&local_118);
        bVar17 = tcu::floatThresholdCompare
                           (log,(char *)uVar82,(char *)uVar83,(ConstPixelBufferAccess *)local_348,
                            (ConstPixelBufferAccess *)local_548,&local_48,COMPARE_LOG_RESULT);
        if (!bVar17) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_348);
          std::ostream::operator<<((ConstPixelBufferAccess *)local_348,iVar19);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_348);
          std::ios_base::~ios_base(local_2d8);
          pTVar26 = (TextureFormat *)
                    std::__cxx11::string::replace
                              ((ulong)&stack0xfffffffffffff978,0,(char *)0x0,0x1c93362);
          local_458 = (undefined1  [8])&local_448;
          TVar47 = (TextureFormat)(pTVar26 + 2);
          if (*pTVar26 == TVar47) {
            local_448._M_allocated_capacity = *(undefined8 *)TVar47;
            local_448._8_8_ = pTVar26[3];
          }
          else {
            local_448._M_allocated_capacity = *(undefined8 *)TVar47;
            local_458 = (undefined1  [8])*pTVar26;
          }
          TStack_450 = pTVar26[1];
          *pTVar26 = TVar47;
          pTVar26[1].order = R;
          pTVar26[1].type = SNORM_INT8;
          *(undefined1 *)&pTVar26[2].order = R;
          pTVar26 = (TextureFormat *)std::__cxx11::string::append(local_458);
          TVar47 = (TextureFormat)(pTVar26 + 2);
          if (*pTVar26 == TVar47) {
            local_538._0_16_ = *(undefined1 (*) [16])TVar47;
            TVar12 = (TextureFormat)local_538;
          }
          else {
            local_538._0_8_ = *(size_type *)TVar47;
            TVar12 = *pTVar26;
          }
          TStack_540.order = pTVar26[1].order;
          TStack_540.type = pTVar26[1].type;
          local_548._0_4_ = TVar12.order;
          local_548._4_4_ = TVar12.type;
          *pTVar26 = TVar47;
          pTVar26[1].order = R;
          pTVar26[1].type = SNORM_INT8;
          *(undefined1 *)&pTVar26[2].order = R;
          tcu::ResultCollector::fail(local_360,(string *)local_548);
          if (local_548 != (undefined1  [8])local_538) {
            operator_delete((void *)local_548,local_538._0_8_ + 1);
          }
          if (local_458 != (undefined1  [8])&local_448) {
            operator_delete((void *)local_458,(ulong)(local_448._M_allocated_capacity + 1));
          }
          if (_Var30._M_p != &stack0xfffffffffffff988) {
            operator_delete(_Var30._M_p,uVar84 + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a8._0_8_ != &local_598) {
          operator_delete((void *)local_5a8._0_8_,local_598._M_allocated_capacity + 1);
        }
        uVar82 = local_608;
        TVar47 = (TextureFormat)local_618._0_8_;
        if ((key_type **)local_618._0_8_ != &local_608) goto LAB_01670bb5;
      }
      else {
        if (TVar21 - TEXTURECHANNELCLASS_SIGNED_INTEGER < 2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_348);
          std::ostream::operator<<((ConstPixelBufferAccess *)local_348,iVar19);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_348);
          std::ios_base::~ios_base(local_2d8);
          pTVar26 = (TextureFormat *)
                    std::__cxx11::string::replace((ulong)local_548,0,(char *)0x0,0x1a1c8a4);
          local_458 = (undefined1  [8])&local_448;
          TVar47 = (TextureFormat)(pTVar26 + 2);
          if (*pTVar26 == TVar47) {
            local_448._M_allocated_capacity = *(undefined8 *)TVar47;
            local_448._8_8_ = pTVar26[3];
          }
          else {
            local_448._M_allocated_capacity = *(undefined8 *)TVar47;
            local_458 = (undefined1  [8])*pTVar26;
          }
          TStack_450 = pTVar26[1];
          *pTVar26 = TVar47;
          pTVar26[1].order = R;
          pTVar26[1].type = SNORM_INT8;
          *(undefined1 *)&pTVar26[2].order = R;
          if (local_548 != (undefined1  [8])local_538) {
            operator_delete((void *)local_548,local_538._0_8_ + 1);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_348);
          std::ostream::operator<<((ConstPixelBufferAccess *)local_348,iVar19);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_348);
          std::ios_base::~ios_base(local_2d8);
          plVar27 = (long *)std::__cxx11::string::replace((ulong)local_548,0,(char *)0x0,0x1c9334c);
          _Var30._M_p = &stack0xfffffffffffff988;
          psVar42 = (size_type *)(plVar27 + 2);
          if ((size_type *)*plVar27 == psVar42) {
            uVar82 = *psVar42;
          }
          else {
            uVar82 = *psVar42;
            _Var30._M_p = (pointer)*plVar27;
          }
          *plVar27 = (long)psVar42;
          plVar27[1] = 0;
          *(undefined1 *)(plVar27 + 2) = 0;
          if (local_548 != (undefined1  [8])local_538) {
            operator_delete((void *)local_548,local_538._0_8_ + 1);
          }
          auVar14 = local_458;
          local_5a8._8_8_ = &DAT_100000001;
          local_5a8._0_8_ = &DAT_100000001;
          _Var80._M_p = _Var30._M_p;
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                    ((ConstPixelBufferAccess *)local_348,pTVar44);
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                    ((ConstPixelBufferAccess *)local_548,(TextureLevel *)&local_118);
          paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_538;
          bVar17 = tcu::intThresholdCompare
                             (log,(char *)auVar14,_Var30._M_p,(ConstPixelBufferAccess *)local_348,
                              (ConstPixelBufferAccess *)local_548,(UVec4 *)local_5a8,
                              COMPARE_LOG_RESULT);
          if (!bVar17) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_348);
            std::ostream::operator<<((ConstPixelBufferAccess *)local_348,iVar19);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_348);
            std::ios_base::~ios_base(local_2d8);
            pTVar26 = (TextureFormat *)
                      std::__cxx11::string::replace((ulong)local_618,0,(char *)0x0,0x1c93362);
            local_5e8._0_8_ = &local_5d8;
            TVar47 = (TextureFormat)(pTVar26 + 2);
            if (*pTVar26 == TVar47) {
              local_5d8._M_allocated_capacity = *(undefined8 *)TVar47;
              local_5d8._8_8_ = pTVar26[3];
            }
            else {
              local_5d8._M_allocated_capacity = *(undefined8 *)TVar47;
              local_5e8._0_8_ = *pTVar26;
            }
            unique0x00012000 = pTVar26[1];
            *pTVar26 = TVar47;
            pTVar26[1].order = R;
            pTVar26[1].type = SNORM_INT8;
            *(undefined1 *)&pTVar26[2].order = R;
            plVar27 = (long *)std::__cxx11::string::append(local_5e8);
            paVar43 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar27 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar27 == paVar43) {
              local_538._0_16_ = *(undefined1 (*) [16])paVar43;
            }
            else {
              local_538._0_8_ = paVar43->_M_allocated_capacity;
              paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar27;
            }
            TStack_540 = (TextureFormat)plVar27[1];
            local_548 = (undefined1  [8])paVar41;
            *plVar27 = (long)paVar43;
            plVar27[1] = 0;
            *(undefined1 *)(plVar27 + 2) = 0;
            tcu::ResultCollector::fail(local_360,(string *)local_548);
LAB_01670b15:
            if (local_548 != (undefined1  [8])local_538) {
              operator_delete((void *)local_548,local_538._0_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5e8._0_8_ != &local_5d8) {
              operator_delete((void *)local_5e8._0_8_,(ulong)(local_5d8._M_allocated_capacity + 1));
            }
            if ((key_type **)local_618._0_8_ != &local_608) {
              operator_delete((void *)local_618._0_8_,
                              (ulong)((long)&(((PixelBufferAccess *)&local_608->_M_dataplus)->
                                             super_ConstPixelBufferAccess).m_format.order + 1));
            }
          }
        }
        else {
          if (TVar21 != TEXTURECHANNELCLASS_FLOATING_POINT) goto LAB_01670bbd;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_348);
          std::ostream::operator<<((ConstPixelBufferAccess *)local_348,iVar19);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_348);
          std::ios_base::~ios_base(local_2d8);
          pTVar26 = (TextureFormat *)
                    std::__cxx11::string::replace((ulong)local_548,0,(char *)0x0,0x1a1c8a4);
          local_458 = (undefined1  [8])&local_448;
          TVar47 = (TextureFormat)(pTVar26 + 2);
          if (*pTVar26 == TVar47) {
            local_448._M_allocated_capacity = *(undefined8 *)TVar47;
            local_448._8_8_ = pTVar26[3];
          }
          else {
            local_448._M_allocated_capacity = *(undefined8 *)TVar47;
            local_458 = (undefined1  [8])*pTVar26;
          }
          TStack_450 = pTVar26[1];
          *pTVar26 = TVar47;
          pTVar26[1].order = R;
          pTVar26[1].type = SNORM_INT8;
          *(undefined1 *)&pTVar26[2].order = R;
          if (local_548 != (undefined1  [8])local_538) {
            operator_delete((void *)local_548,local_538._0_8_ + 1);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_348);
          std::ostream::operator<<((ConstPixelBufferAccess *)local_348,iVar19);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_348);
          std::ios_base::~ios_base(local_2d8);
          puVar37 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)local_548,0,(char *)0x0,0x1c9334c);
          _Var30._M_p = &stack0xfffffffffffff988;
          psVar42 = puVar37 + 2;
          if ((size_type *)*puVar37 == psVar42) {
            uVar82 = *psVar42;
          }
          else {
            uVar82 = *psVar42;
            _Var30._M_p = (pointer)*puVar37;
          }
          *puVar37 = psVar42;
          puVar37[1] = 0;
          *(undefined1 *)(puVar37 + 2) = 0;
          if (local_548 != (undefined1  [8])local_538) {
            operator_delete((void *)local_548,local_538._0_8_ + 1);
          }
          local_5e8._0_8_ =
               local_118.m_shaders[0].
               super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
               super__Vector_impl_data._M_start;
          tcu::getTextureFormatMantissaBitDepth((tcu *)local_348,&local_350);
          IVar76 = tcu::getTextureFormatMantissaBitDepth
                             ((tcu *)local_548,(TextureFormat *)local_5e8);
          auVar14 = local_458;
          auVar57 = local_5a8;
          auVar75._0_4_ = -(uint)((int)local_548._0_4_ < (int)local_348._0_4_);
          auVar75._4_4_ = -(uint)((int)local_548._4_4_ < (int)local_348._4_4_);
          auVar75._8_4_ = -(uint)((int)TStack_540.order < (int)auStack_340._0_4_);
          auVar75._12_4_ = -(uint)((int)TStack_540.type < (int)auStack_340._4_4_);
          uVar23 = movmskps(IVar76.m_data[0],auVar75);
          uVar23 = uVar23 ^ 0xf;
          iVar51 = 0;
          if ((uVar23 & 1) != 0) {
            iVar51 = local_548._0_4_ - local_348._0_4_;
          }
          iVar68 = 0;
          if ((uVar23 & 2) != 0) {
            iVar68 = local_548._4_4_ - local_348._4_4_;
          }
          iVar70 = 0;
          if ((uVar23 & 4) != 0) {
            iVar70 = TStack_540.order - auStack_340._0_4_;
          }
          iVar72 = 0;
          if ((uVar23 & 8) != 0) {
            iVar72 = TStack_540.type - auStack_340._4_4_;
          }
          auVar59._0_4_ = (int)(float)(iVar51 * 0x800000 + 0x3f800000);
          auVar59._4_4_ = (int)(float)(iVar68 * 0x800000 + 0x3f800000);
          auVar59._8_4_ = (int)(float)(iVar70 * 0x800000 + 0x3f800000);
          auVar59._12_4_ = (int)(float)(iVar72 * 0x800000 + 0x3f800000);
          auVar66._4_4_ = auVar59._4_4_;
          auVar66._0_4_ = auVar59._4_4_;
          auVar66._8_4_ = auVar59._12_4_;
          auVar66._12_4_ = auVar59._12_4_;
          local_5a8._4_4_ = auVar59._4_4_ * 4;
          local_5a8._0_4_ = auVar59._0_4_ * 4;
          local_5a8._8_8_ = auVar57._8_8_;
          local_598._M_allocated_capacity._4_4_ = (int)((auVar66._8_8_ & 0xffffffff) * 4);
          local_598._M_allocated_capacity._0_4_ = (int)((auVar59._8_8_ & 0xffffffff) * 4);
          _Var80._M_p = _Var30._M_p;
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                    ((ConstPixelBufferAccess *)local_348,pTVar44);
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                    ((ConstPixelBufferAccess *)local_548,(TextureLevel *)&local_118);
          paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_538;
          bVar17 = tcu::floatUlpThresholdCompare
                             (log,(char *)auVar14,_Var30._M_p,(ConstPixelBufferAccess *)local_348,
                              (ConstPixelBufferAccess *)local_548,(UVec4 *)local_5a8,
                              COMPARE_LOG_RESULT);
          if (!bVar17) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_348);
            std::ostream::operator<<((ConstPixelBufferAccess *)local_348,iVar19);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_348);
            std::ios_base::~ios_base(local_2d8);
            pTVar26 = (TextureFormat *)
                      std::__cxx11::string::replace((ulong)local_618,0,(char *)0x0,0x1c93362);
            local_5e8._0_8_ = &local_5d8;
            TVar47 = (TextureFormat)(pTVar26 + 2);
            if (*pTVar26 == TVar47) {
              local_5d8._M_allocated_capacity = *(undefined8 *)TVar47;
              local_5d8._8_8_ = pTVar26[3];
            }
            else {
              local_5d8._M_allocated_capacity = *(undefined8 *)TVar47;
              local_5e8._0_8_ = *pTVar26;
            }
            unique0x00012000 = pTVar26[1];
            *pTVar26 = TVar47;
            pTVar26[1].order = R;
            pTVar26[1].type = SNORM_INT8;
            *(undefined1 *)&pTVar26[2].order = R;
            plVar27 = (long *)std::__cxx11::string::append(local_5e8);
            paVar43 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar27 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar27 == paVar43) {
              local_538._0_16_ = *(undefined1 (*) [16])paVar43;
            }
            else {
              local_538._0_8_ = paVar43->_M_allocated_capacity;
              paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar27;
            }
            TStack_540 = (TextureFormat)plVar27[1];
            local_548 = (undefined1  [8])paVar41;
            *plVar27 = (long)paVar43;
            plVar27[1] = 0;
            *(undefined1 *)(plVar27 + 2) = 0;
            tcu::ResultCollector::fail(local_360,(string *)local_548);
            goto LAB_01670b15;
          }
        }
        if (_Var80._M_p != &stack0xfffffffffffff988) {
          operator_delete(_Var80._M_p,uVar82 + 1);
        }
        uVar82 = local_448._M_allocated_capacity;
        TVar47 = (TextureFormat)local_458;
        if (local_458 != (undefined1  [8])&local_448) {
LAB_01670bb5:
          operator_delete((void *)TVar47,
                          (ulong)((long)&(((PixelBufferAccess *)&((key_type *)uVar82)->_M_dataplus)
                                         ->super_ConstPixelBufferAccess).m_format.order + 1));
        }
      }
LAB_01670bbd:
      tcu::TextureLevel::~TextureLevel((TextureLevel *)&local_118);
      lVar49 = lVar49 + 1;
    } while (lVar49 < (int)((ulong)((long)local_140.m_objects.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_140.m_objects.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 2));
  }
  (**(code **)(lVar46 + 0x78))(0x8d40,0);
  std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::~vector(&local_1a0);
  glu::ObjectWrapper::~ObjectWrapper(&local_160);
  glu::ObjectVector::~ObjectVector(&local_140);
  return;
}

Assistant:

void runTest (TestLog&						log,
			  tcu::ResultCollector&			results,
			  glu::RenderContext&			renderContext,

			  const BlendState&				preCommonBlendState,
			  const BlendState&				postCommonBlendState,
			  const vector<DrawBufferInfo>&	drawBuffers)
{
	const glw::Functions&	gl					= renderContext.getFunctions();
	glu::RenderbufferVector	renderbuffers		(gl, drawBuffers.size());
	glu::Framebuffer		framebuffer			(gl);
	vector<TextureLevel>	refRenderbuffers	(drawBuffers.size());

	logTestCaseInfo(log, preCommonBlendState, postCommonBlendState, drawBuffers);

	genRenderbuffers(gl, drawBuffers, framebuffer, renderbuffers, refRenderbuffers);

	renderQuad(log, renderContext, preCommonBlendState, postCommonBlendState, drawBuffers, framebuffer, refRenderbuffers);

	verifyRenderbuffers(log, results, renderContext, renderbuffers, framebuffer, refRenderbuffers);
}